

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int SetUnion(char *s1,char *s2)

{
  int local_20;
  int local_1c;
  int progress;
  int i;
  char *s2_local;
  char *s1_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < size; local_1c = local_1c + 1) {
    if ((s2[local_1c] != '\0') && (s1[local_1c] == '\0')) {
      local_20 = 1;
      s1[local_1c] = '\x01';
    }
  }
  return local_20;
}

Assistant:

int SetUnion(char *s1, char *s2)
{
  int i, progress;
  progress = 0;
  for(i=0; i<size; i++){
    if( s2[i]==0 ) continue;
    if( s1[i]==0 ){
      progress = 1;
      s1[i] = 1;
    }
  }
  return progress;
}